

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

bool __thiscall
r_comp::Compiler::read_any
          (Compiler *this,Ptr *node,bool enforce,Class *p,uint16_t write_index,
          uint16_t *extent_index,bool write)

{
  bool bVar1;
  element_type *peVar2;
  size_type __val;
  shared_ptr<r_comp::RepliStruct> local_1a8;
  __cxx11 local_198 [32];
  string local_178 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118 [32];
  shared_ptr<r_comp::RepliStruct> local_f8;
  shared_ptr<r_comp::RepliStruct> local_e8;
  shared_ptr<r_comp::RepliStruct> local_d8;
  shared_ptr<r_comp::RepliStruct> local_c8;
  shared_ptr<r_comp::RepliStruct> local_b8;
  shared_ptr<r_comp::RepliStruct> local_a8;
  shared_ptr<r_comp::RepliStruct> local_98;
  shared_ptr<r_comp::RepliStruct> local_88;
  shared_ptr<r_comp::RepliStruct> local_78 [2];
  shared_ptr<r_comp::RepliStruct> local_58;
  byte local_41;
  uint16_t *puStack_40;
  bool write_local;
  uint16_t *extent_index_local;
  Class *pCStack_30;
  uint16_t write_index_local;
  Class *p_local;
  Ptr *pPStack_20;
  bool enforce_local;
  Ptr *node_local;
  Compiler *this_local;
  
  local_41 = write;
  puStack_40 = extent_index;
  extent_index_local._6_2_ = write_index;
  pCStack_30 = p;
  p_local._7_1_ = enforce;
  pPStack_20 = node;
  node_local = (Ptr *)this;
  std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_58,node);
  bVar1 = read_number(this,&local_58,false,(Class *)0x0,extent_index_local._6_2_,puStack_40,
                      (bool)(local_41 & 1));
  std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_58);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else if ((this->err & 1U) == 0) {
    std::shared_ptr<r_comp::RepliStruct>::shared_ptr(local_78,node);
    bVar1 = read_timestamp(this,local_78,false,(Class *)0x0,extent_index_local._6_2_,puStack_40,
                           (bool)(local_41 & 1));
    std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(local_78);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else if ((this->err & 1U) == 0) {
      std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_88,node);
      bVar1 = read_string(this,&local_88,false,(Class *)0x0,extent_index_local._6_2_,puStack_40,
                          (bool)(local_41 & 1));
      std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_88);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else if ((this->err & 1U) == 0) {
        std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_98,node);
        bVar1 = read_boolean(this,&local_98,false,(Class *)0x0,extent_index_local._6_2_,puStack_40,
                             (bool)(local_41 & 1));
        std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_98);
        if (bVar1) {
          this_local._7_1_ = true;
        }
        else if ((this->err & 1U) == 0) {
          std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_a8,node);
          bVar1 = read_function(this,&local_a8,false,(Class *)0x0,extent_index_local._6_2_,
                                puStack_40,(bool)(local_41 & 1));
          std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_a8);
          if (bVar1) {
            this_local._7_1_ = true;
          }
          else if ((this->err & 1U) == 0) {
            std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_b8,node);
            bVar1 = read_node(this,&local_b8,false,(Class *)0x0,extent_index_local._6_2_,puStack_40,
                              (bool)(local_41 & 1));
            std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_b8);
            if (bVar1) {
              this_local._7_1_ = true;
            }
            else if ((this->err & 1U) == 0) {
              std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_c8,node);
              bVar1 = read_device(this,&local_c8,false,(Class *)0x0,extent_index_local._6_2_,
                                  puStack_40,(bool)(local_41 & 1));
              std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_c8);
              if (bVar1) {
                this_local._7_1_ = true;
              }
              else if ((this->err & 1U) == 0) {
                std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_d8,node);
                bVar1 = read_class(this,&local_d8,false,(Class *)0x0,extent_index_local._6_2_,
                                   puStack_40,(bool)(local_41 & 1));
                std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_d8);
                if (bVar1) {
                  this_local._7_1_ = true;
                }
                else if ((this->err & 1U) == 0) {
                  std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_e8,node);
                  bVar1 = read_expression(this,&local_e8,false,(Class *)0x0,extent_index_local._6_2_
                                          ,puStack_40,(bool)(local_41 & 1));
                  std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_e8);
                  if (bVar1) {
                    this_local._7_1_ = true;
                  }
                  else if ((this->err & 1U) == 0) {
                    std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_f8,node);
                    bVar1 = read_set(this,&local_f8,false,(Class *)0x0,extent_index_local._6_2_,
                                     puStack_40,(bool)(local_41 & 1));
                    std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_f8);
                    if (bVar1) {
                      this_local._7_1_ = true;
                    }
                    else {
                      if ((local_41 & 1) != 0) {
                        std::
                        __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)node);
                        std::operator+((char *)local_178,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)"error: expecting more elements in ");
                        std::operator+(local_158,(char *)local_178);
                        peVar2 = std::
                                 __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                               *)node);
                        __val = std::
                                vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                                ::size(&peVar2->args);
                        std::__cxx11::to_string(local_198,__val);
                        std::operator+(local_138,local_158);
                        std::operator+(local_118,(char *)local_138);
                        std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_1a8,node);
                        set_error(this,local_118,&local_1a8);
                        std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_1a8);
                        std::__cxx11::string::~string((string *)local_118);
                        std::__cxx11::string::~string((string *)local_138);
                        std::__cxx11::string::~string((string *)local_198);
                        std::__cxx11::string::~string((string *)local_158);
                        std::__cxx11::string::~string(local_178);
                      }
                      this_local._7_1_ = false;
                    }
                  }
                  else {
                    this_local._7_1_ = false;
                  }
                }
                else {
                  this_local._7_1_ = false;
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Compiler::read_any(RepliStruct::Ptr node, bool enforce, const Class *p, uint16_t write_index, uint16_t &extent_index, bool write)   // enforce always false, p always NULL.
{
    if (read_number(node, false, nullptr, write_index, extent_index, write)) {
        return true;
    }

    if (err) {
        return false;
    }

    if (read_timestamp(node, false, nullptr, write_index, extent_index, write)) {
        return true;
    }

    if (err) {
        return false;
    }

    if (read_string(node, false, nullptr, write_index, extent_index, write)) {
        return true;
    }

    if (err) {
        return false;
    }

    if (read_boolean(node, false, nullptr, write_index, extent_index, write)) {
        return true;
    }

    if (err) {
        return false;
    }

    if (read_function(node, false, nullptr, write_index, extent_index, write)) {
        return true;
    }

    if (err) {
        return false;
    }

    if (read_node(node, false, nullptr, write_index, extent_index, write)) {
        return true;
    }

    if (err) {
        return false;
    }

    if (read_device(node, false, nullptr, write_index, extent_index, write)) {
        return true;
    }

    if (err) {
        return false;
    }

    if (read_class(node, false, nullptr, write_index, extent_index, write)) {
        return true;
    }

    if (err) {
        return false;
    }

    if (read_expression(node, false, nullptr, write_index, extent_index, write)) {
        return true;
    }

    if (err) {
        return false;
    }

    if (read_set(node, false, nullptr, write_index, extent_index, write)) {
        return true;
    }

    if (write) {
        set_error("error: expecting more elements in " + node->cmd + ", has " + std::to_string(node->args.size()) + " arguments", node);
    }

    return false;
}